

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O3

FrameDisplay * __thiscall Js::DiagStackFrame::GetFrameDisplay(DiagStackFrame *this)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  RegSlot RVar4;
  undefined4 extraout_var;
  FunctionBody *pFVar5;
  undefined4 *puVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ScriptFunction *pSVar7;
  
  iVar3 = (*this->_vptr_DiagStackFrame[2])();
  pFVar5 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (pFVar5 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x47,"(this->GetFunction() != __null)",
                                "this->GetFunction() != NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  iVar3 = (*this->_vptr_DiagStackFrame[2])(this);
  pFVar5 = JavascriptFunction::GetFunctionBody
                     ((JavascriptFunction *)CONCAT44(extraout_var_00,iVar3));
  RVar4 = FunctionBody::GetFrameDisplayRegister(pFVar5);
  if (RVar4 - 1 < 0xfffffffe) {
    UNRECOVERED_JUMPTABLE = this->_vptr_DiagStackFrame[6];
    iVar3 = (*UNRECOVERED_JUMPTABLE)(this,(ulong)RVar4,(ulong)(RVar4 - 1),UNRECOVERED_JUMPTABLE);
    return (FrameDisplay *)CONCAT44(extraout_var_01,iVar3);
  }
  iVar3 = (*this->_vptr_DiagStackFrame[2])(this);
  pSVar7 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>
                     ((JavascriptFunction *)CONCAT44(extraout_var_02,iVar3));
  return (pSVar7->environment).ptr;
}

Assistant:

FrameDisplay * DiagStackFrame::GetFrameDisplay()
    {
        FrameDisplay *display = NULL;

        Assert(this->GetFunction() != NULL);
        RegSlot frameDisplayReg = this->GetFunction()->GetFrameDisplayRegister();

        if (frameDisplayReg != Js::Constants::NoRegister && frameDisplayReg != 0)
        {
            display = (FrameDisplay*)this->GetNonVarRegValue(frameDisplayReg);
        }
        else
        {
            display = this->GetScriptFunction()->GetEnvironment();
        }

        return display;
    }